

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O3

float __thiscall embree::XML::parm_float(XML *this,string *parmID)

{
  int iVar1;
  undefined1 auVar2 [16];
  const_iterator cVar3;
  runtime_error *this_00;
  undefined8 *puVar4;
  long *plVar5;
  _Rb_tree_header *p_Var6;
  string *psVar7;
  float fVar8;
  undefined1 auVar9 [16];
  string *local_a8;
  long local_a0;
  undefined1 local_98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->parms)._M_t,parmID);
  p_Var6 = &(this->parms)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar3._M_node == p_Var6) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ParseLocation::str_abi_cxx11_(&local_68,&this->loc);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_68);
    auVar2._8_8_ = &local_78;
    auVar2._0_8_ = plVar5;
    auVar9._8_8_ = (long *)*plVar5;
    auVar9._0_8_ = plVar5;
    p_Var6 = (_Rb_tree_header *)(plVar5 + 2);
    if ((_Rb_tree_header *)*plVar5 == p_Var6) {
      local_78._M_allocated_capacity = *(undefined8 *)&p_Var6->_M_header;
      local_78._8_8_ = plVar5[3];
      goto LAB_00191012;
    }
  }
  else {
    parmID = *(string **)(cVar3._M_node + 2);
    this_00 = (runtime_error *)__errno_location();
    iVar1 = *(int *)this_00;
    *(int *)this_00 = 0;
    fVar8 = strtof((char *)parmID,(char **)&local_a8);
    if (local_a8 != parmID) {
      if (*(int *)this_00 != 0) {
        if (*(int *)this_00 != 0x22) {
          return fVar8;
        }
        fVar8 = (float)std::__throw_out_of_range("stof");
      }
      *(int *)this_00 = iVar1;
      return fVar8;
    }
    auVar9 = std::__throw_invalid_argument("stof");
  }
  local_78._M_allocated_capacity = *(undefined8 *)&p_Var6->_M_header;
  auVar2 = auVar9;
LAB_00191012:
  local_98._16_8_ = auVar2._8_8_;
  puVar4 = auVar2._0_8_;
  local_98._24_8_ = puVar4[1];
  *puVar4 = p_Var6;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  std::operator+(&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_98 + 0x10),parmID);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_a8 = (string *)*plVar5;
  psVar7 = (string *)(plVar5 + 2);
  if (local_a8 == psVar7) {
    local_98._0_8_ = (psVar7->_M_dataplus)._M_p;
    local_98._8_8_ = plVar5[3];
    local_a8 = (string *)local_98;
  }
  else {
    local_98._0_8_ = (psVar7->_M_dataplus)._M_p;
  }
  local_a0 = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_a8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

float parm_float(const std::string& parmID) const {
      std::map<std::string,std::string>::const_iterator i = parms.find(parmID);
      if (i == parms.end()) THROW_RUNTIME_ERROR (loc.str()+": XML node has no parameter \"" + parmID + "\"");
      return std::stof(i->second);
    }